

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::GenerateInlineAccessorDefinitions
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "inline const $type$& $classname$::$name$(int index) const {\n  return $name$_.$cppget$(index);\n}\ninline $type$* $classname$::mutable_$name$(int index) {\n  return $name$_.Mutable(index);\n}\ninline $type$* $classname$::add_$name$() {\n  return $name$_.Add();\n}\n"
                    );
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::google::protobuf::RepeatedPtrField< $type$ >&\n$classname$::$name$() const {\n  return $name$_;\n}\ninline ::google::protobuf::RepeatedPtrField< $type$ >*\n$classname$::mutable_$name$() {\n  return &$name$_;\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer) const {
  printer->Print(variables_,
    "inline const $type$& $classname$::$name$(int index) const {\n"
    "  return $name$_.$cppget$(index);\n"
    "}\n"
    "inline $type$* $classname$::mutable_$name$(int index) {\n"
    "  return $name$_.Mutable(index);\n"
    "}\n"
    "inline $type$* $classname$::add_$name$() {\n"
    "  return $name$_.Add();\n"
    "}\n");
  printer->Print(variables_,
    "inline const ::google::protobuf::RepeatedPtrField< $type$ >&\n"
    "$classname$::$name$() const {\n"
    "  return $name$_;\n"
    "}\n"
    "inline ::google::protobuf::RepeatedPtrField< $type$ >*\n"
    "$classname$::mutable_$name$() {\n"
    "  return &$name$_;\n"
    "}\n");
}